

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Chapters::Atom::ExpandDisplaysArray(Atom *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  long lVar10;
  Display *pDVar11;
  ulong uVar12;
  Display *pDVar13;
  bool bVar14;
  
  iVar3 = this->m_displays_size;
  bVar14 = true;
  if (iVar3 <= this->m_displays_count) {
    iVar6 = 1;
    if (iVar3 != 0) {
      iVar6 = iVar3 * 2;
    }
    uVar12 = (ulong)iVar6;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar12;
    uVar7 = SUB168(auVar4 * ZEXT816(0x18),0);
    uVar8 = uVar7 + 8;
    if (0xfffffffffffffff7 < uVar7) {
      uVar8 = 0xffffffffffffffff;
    }
    uVar7 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
      uVar7 = uVar8;
    }
    puVar9 = (ulong *)operator_new__(uVar7,(nothrow_t *)&std::nothrow);
    if (puVar9 == (ulong *)0x0) {
      pDVar11 = (Display *)0x0;
    }
    else {
      *puVar9 = uVar12;
      pDVar11 = (Display *)(puVar9 + 1);
      lVar10 = 0;
      pDVar13 = pDVar11;
      do {
        Display::Display(pDVar13);
        lVar10 = lVar10 + -0x18;
        pDVar13 = pDVar13 + 1;
      } while (-lVar10 != uVar12 * 0x18);
    }
    bVar14 = pDVar11 != (Display *)0x0;
    if (bVar14) {
      iVar3 = this->m_displays_count;
      if (0 < (long)iVar3) {
        pDVar13 = this->m_displays;
        lVar10 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pDVar13->m_string + lVar10);
          uVar5 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pDVar11->m_string + lVar10);
          *puVar2 = *puVar1;
          puVar2[1] = uVar5;
          *(undefined8 *)((long)&pDVar11->m_country + lVar10) =
               *(undefined8 *)((long)&pDVar13->m_country + lVar10);
          lVar10 = lVar10 + 0x18;
        } while ((long)iVar3 * 0x18 != lVar10);
      }
      pDVar13 = this->m_displays;
      if (pDVar13 != (Display *)0x0) {
        if (pDVar13[-1].m_country != (char *)0x0) {
          lVar10 = (long)pDVar13[-1].m_country * 0x18;
          do {
            Display::~Display((Display *)((long)&pDVar13[-1].m_string + lVar10));
            lVar10 = lVar10 + -0x18;
          } while (lVar10 != 0);
        }
        operator_delete__(&pDVar13[-1].m_country);
      }
      this->m_displays = pDVar11;
      this->m_displays_size = iVar6;
    }
  }
  return bVar14;
}

Assistant:

bool Chapters::Atom::ExpandDisplaysArray() {
  if (m_displays_size > m_displays_count)
    return true;  // nothing else to do

  const int size = (m_displays_size == 0) ? 1 : 2 * m_displays_size;

  Display* const displays = new (std::nothrow) Display[size];

  if (displays == NULL)
    return false;

  for (int idx = 0; idx < m_displays_count; ++idx) {
    m_displays[idx].ShallowCopy(displays[idx]);
  }

  delete[] m_displays;
  m_displays = displays;

  m_displays_size = size;
  return true;
}